

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

string * __thiscall
ot::commissioner::Interpreter::BaConnModeToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,uint32_t aConnMode)

{
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  undefined4 local_14;
  string *psStack_10;
  uint32_t aConnMode_local;
  
  local_14 = SUB84(this,0);
  psStack_10 = __return_storage_ptr__;
  switch((ulong)this & 0xffffffff) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"disallowed",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"PSKc",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case 2:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"PSKd",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"vendor",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"X.509",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"reserved",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::BaConnModeToString(uint32_t aConnMode)
{
    switch (aConnMode)
    {
    case 0:
        return "disallowed";
    case 1:
        return "PSKc";
    case 2:
        return "PSKd";
    case 3:
        return "vendor";
    case 4:
        return "X.509";
    default:
        return "reserved";
    }
}